

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::to_string_abi_cxx11_(Extent e)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"[",1);
  poVar1 = ::std::operator<<(local_190,(float3 *)&ss);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = ::std::operator<<(poVar1,(float3 *)&stack0x00000014);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return in_RDI;
}

Assistant:

std::string to_string(tinyusdz::Extent e) {
  std::stringstream ss;

  ss << "[" << e.lower << ", " << e.upper << "]";

  return ss.str();
}